

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O3

void jsonip::detail::
     stl_pushbackable_helper<std::vector<std::vector<A,std::allocator<A>>,std::allocator<std::vector<A,std::allocator<A>>>>>
     ::write<jsonip::writer<true>>
               (writer<true> *w,
               vector<std::vector<A,_std::allocator<A>_>,_std::allocator<std::vector<A,_std::allocator<A>_>_>_>
               *t)

{
  pointer t_00;
  
  writer<true>::array_start(w);
  for (t_00 = (t->
              super__Vector_base<std::vector<A,_std::allocator<A>_>,_std::allocator<std::vector<A,_std::allocator<A>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
      t_00 != (t->
              super__Vector_base<std::vector<A,_std::allocator<A>_>,_std::allocator<std::vector<A,_std::allocator<A>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish; t_00 = t_00 + 1) {
    stl_pushbackable_helper<std::vector<A,std::allocator<A>>>::write<jsonip::writer<true>>(w,t_00);
  }
  writer<true>::array_end(w);
  return;
}

Assistant:

static void write(Writer& w, const T& t)
        {
            w.array_start();
            for (typename T::const_iterator it = t.begin(); it != t.end(); ++it)
            {
                slice_helper::type::write(w, *it);
            }
            w.array_end();
        }